

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

bool CoreML::hasSufficientBytesInQuantizedWeightParam(WeightParams *weight,uint64_t units)

{
  QuantizationParams *pQVar1;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  uint uVar5;
  int iVar6;
  QuantizationParams *pQVar7;
  uint uVar8;
  undefined1 uVar9;
  
  pQVar1 = weight->quantization_;
  pQVar7 = pQVar1;
  if (pQVar1 == (QuantizationParams *)0x0) {
    pQVar7 = (QuantizationParams *)&Specification::_QuantizationParams_default_instance_;
  }
  iVar6 = (weight->floatvalue_).current_size_;
  sVar2 = ((weight->float16value_).ptr_)->_M_string_length;
  uVar8 = (0 < iVar6) + 1;
  if (sVar2 == 0) {
    uVar8 = (uint)(0 < iVar6);
  }
  sVar3 = ((weight->rawvalue_).ptr_)->_M_string_length;
  sVar4 = ((weight->int8rawvalue_).ptr_)->_M_string_length;
  uVar5 = (uint)(sVar4 == 0);
  uVar8 = (uVar8 - (sVar3 == 0)) + 2;
  uVar9 = 4;
  if (uVar8 - uVar5 < 2) {
    uVar9 = 5;
    if (uVar8 != uVar5) {
      uVar9 = iVar6 < 1;
    }
    if ((((sVar2 == 0) && (iVar6 < 1)) && (uVar8 != uVar5)) &&
       (((sVar3 == 0 ||
         (uVar9 = 2,
         weight == (WeightParams *)&Specification::_WeightParams_default_instance_ ||
         pQVar1 == (QuantizationParams *)0x0)) &&
        ((sVar4 == 0 ||
         (uVar9 = 3,
         weight == (WeightParams *)&Specification::_WeightParams_default_instance_ ||
         pQVar1 == (QuantizationParams *)0x0)))))) {
      uVar9 = 5;
    }
  }
  switch(uVar9) {
  case 0:
    iVar6 = iVar6 << 2;
    break;
  case 1:
    iVar6 = (int)sVar2;
    break;
  case 2:
    iVar6 = (int)sVar3;
    break;
  case 3:
    iVar6 = (int)sVar4;
    break;
  default:
    iVar6 = 0;
  }
  return pQVar7->numberofbits_ * units + 7 >> 3 <= (ulong)(long)iVar6;
}

Assistant:

inline const ::CoreML::Specification::QuantizationParams& WeightParams::quantization() const {
  // @@protoc_insertion_point(field_get:CoreML.Specification.WeightParams.quantization)
  return quantization_ != NULL ? *quantization_
                         : *::CoreML::Specification::QuantizationParams::internal_default_instance();
}